

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,NumericForStatement *num_for,void *data)

{
  bool bVar1;
  pointer pSVar2;
  undefined8 in_RSI;
  function<void_()> *in_RDI;
  Guard g;
  ExpVarData exp_var_data;
  Guard l;
  SyntaxTree *old_loop;
  Guard *this_00;
  anon_class_16_2_56ec573d *in_stack_fffffffffffffeb8;
  String *name;
  SemanticAnalysisVisitor *this_01;
  anon_class_8_1_8991fb9c local_120 [5];
  Guard local_f8 [2];
  ExpVarData local_b8 [2];
  SyntaxTree *local_98;
  SemanticAnalysisVisitor local_90;
  undefined8 local_68;
  String local_60;
  SyntaxTree *local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  local_20 = GetLoopAST((SemanticAnalysisVisitor *)in_RDI);
  local_68 = local_10;
  name = &local_60;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::NumericForStatement*,void*)::__0,void>
            (in_RDI,in_stack_fffffffffffffeb8);
  local_98 = local_20;
  this_01 = &local_90;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::NumericForStatement*,void*)::__1,void>
            (in_RDI,(anon_class_16_2_3ebab7f7 *)in_stack_fffffffffffffeb8);
  Guard::Guard((Guard *)this_01,(function<void_()> *)name,in_RDI);
  std::function<void_()>::~function((function<void_()> *)0x191a90);
  std::function<void_()>::~function((function<void_()> *)0x191a9d);
  ExpVarData::ExpVarData(local_b8,SemanticOp_Read);
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x191ac2);
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,local_b8);
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x191aee);
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,local_b8);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x191b1a);
  if (bVar1) {
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x191b31);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,local_b8);
  }
  this_00 = local_f8;
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::NumericForStatement*,void*)::__2,void>
            (in_RDI,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffeb8);
  std::function<void()>::
  function<luna::SemanticAnalysisVisitor::Visit(luna::NumericForStatement*,void*)::__3,void>
            (in_RDI,local_120);
  Guard::Guard((Guard *)this_01,(function<void_()> *)name,in_RDI);
  std::function<void_()>::~function((function<void_()> *)0x191bf9);
  std::function<void_()>::~function((function<void_()> *)0x191c03);
  InsertName(this_01,name);
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x191c2c);
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,0);
  Guard::~Guard(this_00);
  Guard::~Guard(this_00);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(NumericForStatement *num_for, void *data)
    {
        SEMANTIC_ANALYSIS_LOOP_GUARD(num_for);
        ExpVarData exp_var_data{ SemanticOp_Read };
        num_for->exp1_->Accept(this, &exp_var_data);
        num_for->exp2_->Accept(this, &exp_var_data);
        if (num_for->exp3_)
            num_for->exp3_->Accept(this, &exp_var_data);

        SEMANTIC_ANALYSIS_GUARD(EnterBlock, LeaveBlock);
        InsertName(num_for->name_.str_);
        num_for->block_->Accept(this, nullptr);
    }